

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_logger-inl.h
# Opt level: O0

int __thiscall
spdlog::async_logger::clone
          (async_logger *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  element_type *peVar1;
  shared_ptr<spdlog::async_logger> cloned;
  shared_ptr<spdlog::async_logger> *in_stack_ffffffffffffffb8;
  
  std::make_shared<spdlog::async_logger,spdlog::async_logger&>((async_logger *)__child_stack);
  peVar1 = std::__shared_ptr_access<spdlog::async_logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<spdlog::async_logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x298dce);
  std::__cxx11::string::operator=((string *)&(peVar1->super_logger).name_,(string *)__child_stack);
  std::shared_ptr<spdlog::logger>::shared_ptr<spdlog::async_logger,void>
            ((shared_ptr<spdlog::logger> *)__child_stack,in_stack_ffffffffffffffb8);
  std::shared_ptr<spdlog::async_logger>::~shared_ptr((shared_ptr<spdlog::async_logger> *)0x298df8);
  return (int)this;
}

Assistant:

SPDLOG_INLINE std::shared_ptr<spdlog::logger> spdlog::async_logger::clone(std::string new_name) {
    auto cloned = std::make_shared<spdlog::async_logger>(*this);
    cloned->name_ = std::move(new_name);
    return cloned;
}